

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_signature_algorithms(st_ptls_signature_algorithms_t *sa,uint8_t **src,uint8_t *end)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  ushort *puVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar3 = 0x32;
  if (1 < (ulong)((long)end - (long)*src)) {
    pbVar4 = *src;
    lVar9 = -2;
    uVar11 = 0;
    pbVar5 = pbVar4;
    do {
      uVar8 = uVar11 * 0x100;
      pbVar7 = pbVar5 + 1;
      *src = pbVar7;
      bVar1 = *pbVar5;
      uVar11 = uVar8 + bVar1;
      pbVar4 = pbVar4 + 1;
      lVar9 = lVar9 + 1;
      pbVar5 = pbVar7;
    } while (lVar9 != 0);
    if (uVar11 <= (ulong)((long)end - (long)pbVar4)) {
      uVar8 = uVar8 | bVar1;
      puVar10 = (ushort *)*src;
      do {
        pbVar5 = pbVar4 + (uVar8 - (long)puVar10);
        iVar3 = 0x32;
        if (1 < (long)pbVar5) {
          uVar11 = (ulong)(ushort)(*puVar10 << 8 | *puVar10 >> 8);
          puVar10 = puVar10 + 1;
          *src = (uint8_t *)puVar10;
          iVar3 = 0;
        }
        iVar6 = 6;
        if (1 < (long)pbVar5) {
          uVar2 = sa->count;
          iVar6 = 0;
          if (uVar2 < 0x10) {
            sa->count = uVar2 + 1;
            sa->list[uVar2] = (uint16_t)uVar11;
          }
        }
        if ((long)pbVar5 < 2) goto LAB_0011e1f4;
      } while ((ushort *)(pbVar7 + uVar8) != puVar10);
      iVar6 = 0;
LAB_0011e1f4:
      bVar12 = iVar6 == 0;
      goto LAB_0011e1f9;
    }
  }
  bVar12 = false;
LAB_0011e1f9:
  if ((bVar12) && (iVar3 = 0x32, *src == end)) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int decode_signature_algorithms(struct st_ptls_signature_algorithms_t *sa, const uint8_t **src, const uint8_t *end)
{
    int ret;

    ptls_decode_block(*src, end, 2, {
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, src, end)) != 0)
                goto Exit;
            if (sa->count < sizeof(sa->list) / sizeof(sa->list[0]))
                sa->list[sa->count++] = id;
        } while (*src != end);
    });

    ret = 0;
Exit:
    return ret;
}